

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

void __thiscall wallet::LegacyDataSPKM::AddInactiveHDChain(LegacyDataSPKM *this,CHDChain *chain)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int64_t iVar6;
  bool bVar7;
  mapped_type *pmVar8;
  key_type *in_RSI;
  AnnotatedMixin<std::recursive_mutex> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock31;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffa8;
  unordered_map<CKeyID,_wallet::CHDChain,_SaltedSipHasher,_std::equal_to<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CHDChain>_>_>
  *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffcb;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffffa8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffffe8,in_RDI,(char *)in_RSI,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc,(bool)in_stack_ffffffffffffffcb);
  bVar7 = base_blob<160U>::IsNull((base_blob<160U> *)in_stack_ffffffffffffffb8);
  if (((bVar7 ^ 0xffU) & 1) == 0) {
    __assert_fail("!chain.seed_id.IsNull()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,1000,"void wallet::LegacyDataSPKM::AddInactiveHDChain(const CHDChain &)");
  }
  pmVar8 = std::
           unordered_map<CKeyID,_wallet::CHDChain,_SaltedSipHasher,_std::equal_to<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CHDChain>_>_>
           ::operator[](in_stack_ffffffffffffffb8,in_RSI);
  pmVar8->nVersion = *(int *)(in_RSI[2].super_uint160.super_base_blob<160U>.m_data._M_elems + 8);
  uVar2 = *(undefined8 *)(in_RSI->super_uint160).super_base_blob<160U>.m_data._M_elems;
  uVar3 = *(undefined8 *)((in_RSI->super_uint160).super_base_blob<160U>.m_data._M_elems + 8);
  uVar4 = *(undefined8 *)((in_RSI->super_uint160).super_base_blob<160U>.m_data._M_elems + 0x10);
  uVar5 = *(undefined8 *)(in_RSI[1].super_uint160.super_base_blob<160U>.m_data._M_elems + 4);
  iVar6 = *(int64_t *)in_RSI[2].super_uint160.super_base_blob<160U>.m_data._M_elems;
  pmVar8->m_next_external_index =
       *(int64_t *)(in_RSI[1].super_uint160.super_base_blob<160U>.m_data._M_elems + 0xc);
  pmVar8->m_next_internal_index = iVar6;
  *(undefined8 *)((pmVar8->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 8) = uVar4
  ;
  *(undefined8 *)((pmVar8->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10) =
       uVar5;
  pmVar8->nExternalChainCounter = (int)uVar2;
  pmVar8->nInternalChainCounter = (int)((ulong)uVar2 >> 0x20);
  *(undefined8 *)(pmVar8->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems = uVar3;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LegacyDataSPKM::AddInactiveHDChain(const CHDChain& chain)
{
    LOCK(cs_KeyStore);
    assert(!chain.seed_id.IsNull());
    m_inactive_hd_chains[chain.seed_id] = chain;
}